

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bezier.cpp
# Opt level: O0

ON_BezierCurve * __thiscall ON_BezierCurve::operator=(ON_BezierCurve *this,ON_PolynomialCurve *src)

{
  double dVar1;
  undefined8 t_00;
  bool bVar2;
  int iVar3;
  ON_4dPoint *pOVar4;
  double *pdVar5;
  int local_f4;
  int local_b4;
  ON_4dPointArray local_a8;
  undefined1 local_90 [8];
  ON_4dPointArray pt;
  double t;
  double d;
  int degree;
  undefined1 local_58 [8];
  ON_PolynomialCurve s;
  int i;
  ON_PolynomialCurve *src_local;
  ON_BezierCurve *this_local;
  
  if (((src->m_dim < 1) ||
      (iVar3 = ON_SimpleArray<ON_4dPoint>::Count(&(src->m_cv).super_ON_SimpleArray<ON_4dPoint>),
      iVar3 != src->m_order)) || (src->m_order < 2)) {
    Destroy(this);
  }
  else {
    ON_PolynomialCurve::ON_PolynomialCurve((ON_PolynomialCurve *)local_58);
    if (src->m_is_rat == 0) {
      local_b4 = src->m_dim;
    }
    else {
      local_b4 = 4;
    }
    local_58._0_4_ = local_b4;
    local_58._4_4_ = 0;
    s.m_cv.super_ON_SimpleArray<ON_4dPoint>.m_count = 0;
    s.m_cv.super_ON_SimpleArray<ON_4dPoint>.m_capacity = 0;
    s.m_domain.m_t[0] = 1.0;
    s.m_dim = src->m_order;
    ON_4dPointArray::operator=((ON_4dPointArray *)&s.m_order,&src->m_cv);
    if (src->m_is_rat != 0) {
      this->m_dim = this->m_dim + 1;
      this->m_is_rat = 0;
    }
    iVar3 = src->m_order + -1;
    ON_4dPointArray::ON_4dPointArray((ON_4dPointArray *)local_90,src->m_order);
    for (s.m_domain.m_t[1]._4_4_ = 0; s.m_domain.m_t[1]._4_4_ < src->m_order;
        s.m_domain.m_t[1]._4_4_ = s.m_domain.m_t[1]._4_4_ + 1) {
      if (s.m_domain.m_t[1]._4_4_ == 0) {
        pt.super_ON_SimpleArray<ON_4dPoint>.m_count = 0;
        pt.super_ON_SimpleArray<ON_4dPoint>.m_capacity = 0;
      }
      else if (s.m_domain.m_t[1]._4_4_ < iVar3) {
        pt.super_ON_SimpleArray<ON_4dPoint>._16_8_ =
             (double)s.m_domain.m_t[1]._4_4_ * (1.0 / (double)iVar3);
      }
      else {
        pt.super_ON_SimpleArray<ON_4dPoint>.m_count = 0;
        pt.super_ON_SimpleArray<ON_4dPoint>.m_capacity = 0x3ff00000;
      }
      t_00 = pt.super_ON_SimpleArray<ON_4dPoint>._16_8_;
      pOVar4 = ON_SimpleArray<ON_4dPoint>::operator[]
                         ((ON_SimpleArray<ON_4dPoint> *)local_90,s.m_domain.m_t[1]._4_4_);
      pdVar5 = ON_4dPoint::operator_cast_to_double_(pOVar4);
      ON_PolynomialCurve::Evaluate((ON_PolynomialCurve *)local_58,(double)t_00,0,4,pdVar5);
    }
    ON_4dPointArray::ON_4dPointArray(&local_a8,0);
    ON_4dPointArray::operator=((ON_4dPointArray *)&s.m_order,&local_a8);
    ON_4dPointArray::~ON_4dPointArray(&local_a8);
    if ((src->m_is_rat != 0) && (src->m_dim < 3)) {
      for (s.m_domain.m_t[1]._4_4_ = 0; s.m_domain.m_t[1]._4_4_ < src->m_order;
          s.m_domain.m_t[1]._4_4_ = s.m_domain.m_t[1]._4_4_ + 1) {
        pOVar4 = ON_SimpleArray<ON_4dPoint>::operator[]
                           ((ON_SimpleArray<ON_4dPoint> *)local_90,s.m_domain.m_t[1]._4_4_);
        dVar1 = pOVar4->w;
        pOVar4 = ON_SimpleArray<ON_4dPoint>::operator[]
                           ((ON_SimpleArray<ON_4dPoint> *)local_90,s.m_domain.m_t[1]._4_4_);
        pdVar5 = ON_4dPoint::operator[](pOVar4,src->m_dim);
        *pdVar5 = dVar1;
      }
    }
    if (src->m_is_rat == 0) {
      local_f4 = src->m_dim;
    }
    else {
      local_f4 = src->m_dim + 1;
    }
    iVar3 = src->m_order;
    pOVar4 = ON_SimpleArray<ON_4dPoint>::operator[]((ON_SimpleArray<ON_4dPoint> *)local_90,0);
    Loft(this,local_f4,iVar3,4,&pOVar4->x,0,(double *)0x0);
    bVar2 = IsValid(this);
    if ((bVar2) && (src->m_is_rat != 0)) {
      this->m_is_rat = 1;
      this->m_dim = this->m_dim + -1;
    }
    ON_4dPointArray::~ON_4dPointArray((ON_4dPointArray *)local_90);
    ON_PolynomialCurve::~ON_PolynomialCurve((ON_PolynomialCurve *)local_58);
  }
  return this;
}

Assistant:

ON_BezierCurve& ON_BezierCurve::operator=(const ON_PolynomialCurve& src)
{
  //m_domain = src.m_domain;
  if ( src.m_dim > 0 && src.m_cv.Count() == src.m_order && src.m_order >= 2 ) 
  {
    int i;
    
    ON_PolynomialCurve s; // scratch poly for homogeneous evaluation
    s.m_dim = src.m_is_rat ? 4 : src.m_dim; 
    s.m_is_rat = 0;
    s.m_domain.m_t[0] = 0.0;
    s.m_domain.m_t[1] = 1.0;
    s.m_order = src.m_order;
    s.m_cv = src.m_cv;

    if ( src.m_is_rat ) {
      m_dim++;
      m_is_rat = 0;
    }     
    const int degree = src.m_order-1;
    const double d = 1.0/degree;
    double t;
    ON_4dPointArray pt(src.m_order);
    for ( i = 0; i < src.m_order; i++ ) 
    {
      if ( i == 0 )
        t = 0.0;
      else if ( i < degree )
        t = i*d;
      else
        t = 1.0;
      s.Evaluate( t, 0, 4, pt[i] );
    }
    s.m_cv = 0;
    if ( src.m_is_rat && src.m_dim < 3 ) {
      for ( i = 0; i < src.m_order; i++ )
        pt[i][src.m_dim] = pt[i].w;
    }
    Loft( src.m_is_rat ? src.m_dim+1 : src.m_dim, src.m_order, 4, &pt[0].x, 0, nullptr );
    if ( IsValid() && src.m_is_rat ) {
      m_is_rat = 1;
      m_dim--;
    }
  }
  else {
    Destroy();
  }
  
  return *this;
}